

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O0

EventLoop * __thiscall EventLoopThread::startLoop(EventLoopThread *this)

{
  bool bVar1;
  MutexLock *_mutex;
  MutexLockGuard local_18;
  MutexLockGuard lock;
  EventLoopThread *this_local;
  
  lock.mutex = (MutexLock *)this;
  bVar1 = Thread::started(&this->thread_);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!thread_.started()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Ventery[P]WebServer/WebServer/EventLoopThread.cpp"
                  ,0x15,"EventLoop *EventLoopThread::startLoop()");
  }
  Thread::start(&this->thread_);
  _mutex = &this->mutex_;
  MutexLockGuard::MutexLockGuard(&local_18,_mutex);
  while (this->loop_ == (EventLoop *)0x0) {
    Condition::wait(&this->cond_,_mutex);
  }
  MutexLockGuard::~MutexLockGuard(&local_18);
  return this->loop_;
}

Assistant:

EventLoop* EventLoopThread::startLoop() {
  assert(!thread_.started());
  thread_.start();
  {
    MutexLockGuard lock(mutex_);
    // 一直等到threadFun在Thread里真正跑起来
    while (loop_ == NULL) cond_.wait();
  }
  return loop_;
}